

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O3

void __thiscall
scp::Tensor<std::complex<double>_>::_ndCooleyTukey
          (Tensor<std::complex<double>_> *this,complex<double> *beg,uint64_t order,
          complex<double> **bases)

{
  uint64_t size;
  uint64_t stride;
  ulong *puVar1;
  complex<double> *pcVar2;
  ulong *puVar3;
  long lVar4;
  ulong n;
  ulong uVar5;
  int iVar6;
  uint64_t uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  factorsCopy;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  factors;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_88;
  uint64_t local_68;
  uint64_t local_60;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_58;
  long local_40;
  uint64_t local_38;
  
  puVar1 = (this->_shape).sizes + (this->_shape).order;
  puVar3 = puVar1 + -order;
  if (puVar3 + 1 == puVar1) {
    iVar6 = 1;
  }
  else {
    lVar4 = order * -8 + 8;
    iVar6 = 1;
    do {
      iVar6 = iVar6 * *(int *)((long)puVar1 + lVar4);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0);
  }
  local_60 = (uint64_t)iVar6;
  n = *puVar3;
  local_68 = order;
  if (1 < order) {
    if (n == 0) {
      return;
    }
    local_38 = order - 1;
    local_40 = local_60 << 4;
    uVar5 = 0;
    pcVar2 = beg;
    do {
      _ndCooleyTukey(this,pcVar2,local_38,bases);
      uVar5 = uVar5 + 1;
      n = *puVar3;
      pcVar2 = (complex<double> *)(pcVar2->_M_value + local_40);
    } while (uVar5 < n);
  }
  stride = local_60;
  if (1 < n) {
    pcVar2 = bases[(this->_shape).order - local_68];
    if ((n & n - 1) == 0) {
      uVar7 = local_60;
      if (iVar6 != 0) {
        do {
          size = *puVar3;
          auVar9._8_4_ = (int)(size >> 0x20);
          auVar9._0_8_ = size;
          auVar9._12_4_ = 0x45300000;
          dVar8 = log2((auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0));
          _scp::bitReversal<std::complex<double>>(beg,stride,size,(uint8_t)(int)dVar8);
          _scp::cooleyTukeyRadix2<std::complex<double>>(beg,stride,pcVar2,1,*puVar3);
          beg = beg + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
    }
    else {
      local_58.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_long,_unsigned_long> *)0x0;
      local_88.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      primeFactors<unsigned_long>(n,&local_58);
      if (iVar6 != 0) {
        uVar7 = stride;
        do {
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::operator=(&local_88,&local_58);
          _scp::cooleyTukey<std::complex<double>>
                    (beg,stride,pcVar2,1,*puVar3,
                     local_88.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (long)local_88.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
          beg = beg + 1;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
        if (local_88.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0)
        {
          operator_delete(local_88.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (local_58.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

constexpr void Tensor<TValue>::_ndCooleyTukey(TValue* beg, uint64_t order, const TValue* const* bases)
	{
		const uint64_t& size = *(_shape.sizes + _shape.order - order);
		
		const uint64_t subLength = std::accumulate(_shape.sizes + _shape.order - order + 1, _shape.sizes + _shape.order, 1, std::multiplies<uint64_t>());
		
		if (order > 1)
		{
			for (uint64_t i = 0; i < size; ++i)
			{
				_ndCooleyTukey(beg + i * subLength, order - 1, bases);
			}
		}

		if (size > 1)
		{
			const TValue* base = bases[_shape.order - order];

			if ((size & (size - 1)) == 0)
			{
				for (uint64_t i = 0; i < subLength; ++i)
				{
					_scp::bitReversal(beg + i, subLength, size, std::log2(size));
					_scp::cooleyTukeyRadix2(beg + i, subLength, base, 1, size);
				}
			}
			else
			{
				std::vector<std::pair<uint64_t, uint64_t>> factors, factorsCopy;
				primeFactors(size, factors);

				for (uint64_t i = 0; i < subLength; ++i)
				{
					factorsCopy = factors;
					_scp::cooleyTukey(beg + i, subLength, base, 1, size, factorsCopy.data(), factorsCopy.size());
				}
			}
		}
	}